

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Maybe<kj::CompressionParameters> *
kj::_::tryParseExtensionOffers
          (Maybe<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers)

{
  ArrayPtr<const_char> *pAVar1;
  RemoveConst<kj::ArrayPtr<const_char>_> *pRVar2;
  ArrayPtr<const_char> *pAVar3;
  RemoveConst<kj::ArrayPtr<const_char>_> *pRVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  int iVar8;
  int iVar9;
  long in_R8;
  ArrayPtr<const_char> *pAVar10;
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::ArrayPtr<const_char>_> splitOffers;
  bool local_d0;
  bool local_cf;
  undefined2 local_ce;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_c8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_c0;
  Vector<kj::ArrayPtr<const_char>_> local_b8;
  Vector<kj::ArrayPtr<const_char>_> local_98;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_70;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_68;
  Maybe<kj::CompressionParameters> local_60;
  
  input.ptr = (char *)(offers.content.size_ - 1);
  input.size_ = 0x2c;
  splitParts(&local_98,(_ *)offers.content.ptr,input,(char)in_R8);
  pRVar4 = local_98.builder.pos;
  if (local_98.builder.ptr == local_98.builder.pos) {
    uVar7 = false;
  }
  else {
    uVar7 = (__return_storage_ptr__->ptr).isSet;
    local_ce = *(undefined2 *)&(__return_storage_ptr__->ptr).field_1;
    local_d0 = (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet;
    local_c8 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                ((long)&(__return_storage_ptr__->ptr).field_1 + 0x10);
    local_cf = (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet;
    local_c0 = *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
                ((long)&(__return_storage_ptr__->ptr).field_1 + 0x20);
    pAVar10 = local_98.builder.ptr;
    do {
      input_00.size_ = 0x3b;
      input_00.ptr = (char *)pAVar10->size_;
      splitParts(&local_b8,(_ *)pAVar10->ptr,input_00,(char)in_R8);
      iVar9 = 3;
      if (((local_b8.builder.ptr)->size_ == 0x12) &&
         (iVar8 = bcmp((local_b8.builder.ptr)->ptr,"permessage-deflate",0x12), iVar8 == 0)) {
        tryExtractParameters(&local_60,&local_b8,false);
        uVar6 = local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet;
        uVar5 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet;
        if (local_60.ptr.isSet == true) {
          if (local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet == true) {
            local_68 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
            local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet = false;
          }
          if (local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet == true) {
            local_70 = local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
            local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet = false;
          }
          if ((bool)uVar5 != false) {
            local_c8 = local_68;
          }
          local_ce = local_60.ptr.field_1._0_2_;
          if ((bool)uVar6 != false) {
            local_c0 = local_70;
          }
          iVar9 = 1;
          uVar7 = 1;
          local_cf = (bool)uVar6;
          local_d0 = (bool)uVar5;
        }
        else {
          iVar9 = 0;
        }
      }
      pAVar3 = local_b8.builder.endPtr;
      pRVar2 = local_b8.builder.pos;
      pAVar1 = local_b8.builder.ptr;
      if (local_b8.builder.ptr != (ArrayPtr<const_char> *)0x0) {
        local_b8.builder.ptr = (ArrayPtr<const_char> *)0x0;
        local_b8.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
        local_b8.builder.endPtr = (ArrayPtr<const_char> *)0x0;
        in_R8 = (long)pAVar3 - (long)pAVar1 >> 4;
        (**(local_b8.builder.disposer)->_vptr_ArrayDisposer)
                  (local_b8.builder.disposer,pAVar1,0x10,(long)pRVar2 - (long)pAVar1 >> 4,in_R8,0);
      }
      if ((iVar9 != 3) && (iVar9 != 0)) goto LAB_0040680c;
      pAVar10 = pAVar10 + 1;
    } while (pAVar10 != pRVar4);
    uVar7 = 0;
LAB_0040680c:
    *(undefined2 *)&(__return_storage_ptr__->ptr).field_1 = local_ce;
    (__return_storage_ptr__->ptr).field_1.value.outboundMaxWindowBits.ptr.isSet = local_d0;
    *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
     ((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = local_c8;
    (__return_storage_ptr__->ptr).field_1.value.inboundMaxWindowBits.ptr.isSet = local_cf;
    *(anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 *)
     ((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = local_c0;
  }
  pAVar1 = local_98.builder.endPtr;
  pRVar4 = local_98.builder.pos;
  pAVar10 = local_98.builder.ptr;
  (__return_storage_ptr__->ptr).isSet = (bool)uVar7;
  if (local_98.builder.ptr != (ArrayPtr<const_char> *)0x0) {
    local_98.builder.ptr = (ArrayPtr<const_char> *)0x0;
    local_98.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
    local_98.builder.endPtr = (ArrayPtr<const_char> *)0x0;
    (**(local_98.builder.disposer)->_vptr_ArrayDisposer)
              (local_98.builder.disposer,pAVar10,0x10,(long)pRVar4 - (long)pAVar10 >> 4,
               (long)pAVar1 - (long)pAVar10 >> 4,0);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<CompressionParameters> tryParseExtensionOffers(StringPtr offers) {
  // Given a string of offers, accept the first valid offer by returning a `CompressionParameters`
  // struct. If there are no valid offers, return `kj::none`.
  auto splitOffers = splitParts(offers, ',');

  for (const auto& offer : splitOffers) {
    auto splitOffer = splitParts(offer, ';');

    if (splitOffer.front() != "permessage-deflate"_kj) {
      // Extension token was invalid.
      continue;
    }
    KJ_IF_SOME(config, tryExtractParameters(splitOffer, false)) {
      return kj::mv(config);
    }
  }
  return kj::none;
}